

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  Printer *this_00;
  int iVar2;
  uint *puVar3;
  int i_00;
  FieldDescriptor *field_00;
  string local_78;
  FieldDescriptor *local_58;
  FieldDescriptor *field;
  int i;
  int local_40 [2];
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_40[1] = 1;
  local_18 = printer;
  printer_local = (Printer *)this;
  local_40[0] = Descriptor::field_count(this->descriptor_);
  puVar3 = (uint *)std::max<int>(local_40 + 1,local_40);
  SimpleItoa_abi_cxx11_(&local_38,(protobuf *)(ulong)*puVar3,i_00);
  io::Printer::Print(printer,"static const int $classname$_offsets_[$field_count$] = {\n",
                     "classname",&this->classname_,"field_count",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Indent(local_18);
  field._0_4_ = 0;
  while( true ) {
    iVar1 = (int)field;
    iVar2 = Descriptor::field_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    local_58 = Descriptor::field(this->descriptor_,(int)field);
    this_00 = local_18;
    FieldName_abi_cxx11_(&local_78,(cpp *)local_58,field_00);
    io::Printer::Print(this_00,
                       "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, $name$_),\n",
                       "classname",&this->classname_,"name",&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    field._0_4_ = (int)field + 1;
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"};\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateOffsets(io::Printer* printer) {
  printer->Print(
    "static const int $classname$_offsets_[$field_count$] = {\n",
    "classname", classname_,
    "field_count", SimpleItoa(max(1, descriptor_->field_count())));
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    printer->Print(
      "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, $name$_),\n",
      "classname", classname_,
      "name", FieldName(field));
  }

  printer->Outdent();
  printer->Print("};\n");
}